

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

vector3 * vector3_normalize(vector3 *self)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  
  auVar3 = *(undefined1 (*) [16])&self->field_0;
  dVar1 = (self->field_0).v[2];
  dVar4 = SQRT(dVar1 * dVar1 + auVar3._0_8_ * auVar3._0_8_ + auVar3._8_8_ * auVar3._8_8_);
  if (1e-05 <= dVar4) {
    auVar2._8_8_ = dVar4;
    auVar2._0_8_ = dVar4;
    auVar3 = divpd(auVar3,auVar2);
    *(undefined1 (*) [16])&self->field_0 = auVar3;
    (self->field_0).v[2] = dVar1 / dVar4;
  }
  return self;
}

Assistant:

HYPAPI struct vector3 *vector3_normalize(struct vector3 *self)
{
	HYP_FLOAT mag;

	mag = vector3_magnitude(self);

	if (scalar_equalsf(mag, 0.0f)) {
		/* can't normalize a zero
		 * avoid divide by zero
		 */
		return self;
	}

	self->x = self->x / mag;
	self->y = self->y / mag;
	self->z = self->z / mag;

	return self;
}